

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yoml-parser.h
# Opt level: O3

int yoml__resolve_merge(yoml_t **target,yaml_parser_t *parser,yoml_parse_args_t *parse_args)

{
  long *plVar1;
  yoml_type_t yVar2;
  yoml_t *node;
  yoml_t *node_00;
  int *piVar3;
  int *piVar4;
  long lVar5;
  size_t sVar6;
  int iVar7;
  yoml_t *pyVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  undefined8 *puVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  char *pcVar16;
  size_t sVar17;
  
  pyVar8 = *target;
  yVar2 = pyVar8->type;
  if (yVar2 == YOML_TYPE_SEQUENCE) {
    if ((pyVar8->data).scalar == (char *)0x0) {
      return 0;
    }
    lVar9 = 0x40;
    pcVar16 = (char *)0x0;
    do {
      iVar7 = yoml__resolve_merge((yoml_t **)((long)&pyVar8->type + lVar9),parser,parse_args);
      if (iVar7 != 0) {
        return -1;
      }
      pcVar16 = pcVar16 + 1;
      pyVar8 = *target;
      lVar9 = lVar9 + 8;
    } while (pcVar16 != (pyVar8->data).scalar);
  }
  else {
    if (yVar2 != YOML_TYPE_MAPPING) {
      if (yVar2 == YOML__TYPE_UNRESOLVED_ALIAS) {
        __assert_fail("!\"unreachable\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/yoml/yoml-parser.h"
                      ,0x10c,
                      "int yoml__resolve_merge(yoml_t **, yaml_parser_t *, yoml_parse_args_t *)");
      }
      return 0;
    }
    sVar17 = (pyVar8->data).sequence.size;
    if (sVar17 == 0) {
      return 0;
    }
    do {
      sVar15 = sVar17 - 1;
      lVar9 = sVar17 * 0x10;
      iVar7 = yoml__resolve_merge((yoml_t **)(&(*target)->_refcnt + sVar17 * 2),parser,parse_args);
      if (iVar7 != 0) {
        return -1;
      }
      iVar7 = yoml__resolve_merge((yoml_t **)((long)&(*target)->data + lVar9),parser,parse_args);
      if (iVar7 != 0) {
        return -1;
      }
      pyVar8 = *target;
      node = (yoml_t *)(&pyVar8->_refcnt)[sVar17 * 2];
      if ((((node->type == YOML_TYPE_SCALAR) && (pcVar16 = (node->data).scalar, *pcVar16 == '<')) &&
          (pcVar16[1] == '<')) && (pcVar16[2] == '\0')) {
        node_00 = *(yoml_t **)((long)&pyVar8->data + lVar9);
        memmove(&pyVar8->_refcnt + sVar17 * 2,(void *)((long)&pyVar8->data + lVar9 + 8),
                ((long)(pyVar8->data).scalar - sVar17) * 0x10);
        ((*target)->data).scalar = (char *)(((*target)->data).sequence.size - 1);
        if (node_00->type == YOML_TYPE_MAPPING) {
          pcVar16 = (node_00->data).scalar;
          if (pcVar16 != (char *)0x0) {
            pyVar8 = *target;
            pcVar10 = (char *)0x0;
            sVar17 = sVar15;
            do {
              piVar3 = *(int **)((long)&node_00->data + (long)pcVar10 * 0x10 + 8);
              lVar9 = *(long *)((long)&node_00->data + (long)pcVar10 * 0x10 + 0x10);
              sVar6 = (pyVar8->data).sequence.size;
              sVar13 = sVar6;
              if ((*piVar3 == 0) && (sVar13 = sVar17, sVar17 != sVar6)) {
                puVar12 = (undefined8 *)((long)&pyVar8->data + sVar17 * 0x10 + 8);
                sVar14 = sVar6;
                do {
                  if ((*(int *)*puVar12 == 0) &&
                     (iVar7 = strcmp(*(char **)((int *)*puVar12 + 0xe),*(char **)(piVar3 + 0xe)),
                     iVar7 == 0)) goto LAB_00191b54;
                  sVar14 = sVar14 - 1;
                  puVar12 = puVar12 + 2;
                  sVar13 = sVar6;
                } while (sVar17 != sVar14);
              }
              pyVar8 = (yoml_t *)realloc(pyVar8,sVar13 * 0x10 + 0x50);
              *target = pyVar8;
              lVar11 = sVar17 * 0x10;
              memmove(&pyVar8[1].type + sVar17 * 4,(void *)((long)&pyVar8->data + lVar11 + 8),
                      ((long)(pyVar8->data).scalar - sVar17) * 0x10);
              *(int **)((long)&pyVar8->data + lVar11 + 8) = piVar3;
              *(long *)(piVar3 + 0xc) = *(long *)(piVar3 + 0xc) + 1;
              *(long *)((long)&pyVar8->data + lVar11 + 0x10) = lVar9;
              plVar1 = (long *)(lVar9 + 0x30);
              *plVar1 = *plVar1 + 1;
              (pyVar8->data).scalar = (char *)((pyVar8->data).sequence.size + 1);
              sVar17 = sVar17 + 1;
              pcVar16 = (node_00->data).scalar;
LAB_00191b54:
              pcVar10 = pcVar10 + 1;
            } while (pcVar10 != pcVar16);
          }
        }
        else {
          if (node_00->type != YOML_TYPE_SEQUENCE) {
LAB_00191bdf:
            if (parser == (yaml_parser_t *)0x0) {
              return -1;
            }
            parser->problem = "value of the merge key MUST be a mapping or a sequence of mappings";
            sVar17 = node->column;
            (parser->problem_mark).line = node->line;
            (parser->problem_mark).column = sVar17;
            return -1;
          }
          pcVar16 = (node_00->data).scalar;
          if (pcVar16 != (char *)0x0) {
            pcVar10 = (char *)0x0;
            do {
              piVar3 = *(int **)((long)&node_00->data + (long)pcVar10 * 8 + 8);
              if (*piVar3 != 2) goto LAB_00191bdf;
              lVar9 = *(long *)(piVar3 + 0xe);
              if (lVar9 != 0) {
                pyVar8 = *target;
                lVar11 = 0;
                sVar17 = sVar15;
                do {
                  piVar4 = *(int **)(piVar3 + lVar11 * 4 + 0x10);
                  lVar5 = *(long *)(piVar3 + lVar11 * 4 + 0x12);
                  sVar6 = (pyVar8->data).sequence.size;
                  sVar13 = sVar6;
                  if ((*piVar4 == 0) && (sVar13 = sVar17, sVar17 != sVar6)) {
                    puVar12 = (undefined8 *)((long)&pyVar8->data + sVar17 * 0x10 + 8);
                    sVar14 = sVar6;
                    do {
                      if ((*(int *)*puVar12 == 0) &&
                         (iVar7 = strcmp(*(char **)((int *)*puVar12 + 0xe),*(char **)(piVar4 + 0xe))
                         , iVar7 == 0)) goto LAB_00191a00;
                      sVar14 = sVar14 - 1;
                      puVar12 = puVar12 + 2;
                      sVar13 = sVar6;
                    } while (sVar17 != sVar14);
                  }
                  pyVar8 = (yoml_t *)realloc(pyVar8,sVar13 * 0x10 + 0x50);
                  *target = pyVar8;
                  lVar9 = sVar17 * 0x10;
                  memmove(&pyVar8[1].type + sVar17 * 4,(void *)((long)&pyVar8->data + lVar9 + 8),
                          ((long)(pyVar8->data).scalar - sVar17) * 0x10);
                  *(int **)((long)&pyVar8->data + lVar9 + 8) = piVar4;
                  *(long *)(piVar4 + 0xc) = *(long *)(piVar4 + 0xc) + 1;
                  *(long *)((long)&pyVar8->data + lVar9 + 0x10) = lVar5;
                  plVar1 = (long *)(lVar5 + 0x30);
                  *plVar1 = *plVar1 + 1;
                  (pyVar8->data).scalar = (char *)((pyVar8->data).sequence.size + 1);
                  sVar17 = sVar17 + 1;
                  lVar9 = *(long *)(piVar3 + 0xe);
LAB_00191a00:
                  lVar11 = lVar11 + 1;
                } while (lVar11 != lVar9);
                pcVar16 = (node_00->data).scalar;
              }
              pcVar10 = pcVar10 + 1;
            } while (pcVar10 != pcVar16);
          }
        }
        yoml_free(node,parse_args->mem_set);
        yoml_free(node_00,parse_args->mem_set);
      }
      sVar17 = sVar15;
    } while (sVar15 != 0);
  }
  return 0;
}

Assistant:

static inline int yoml__resolve_merge(yoml_t **target, yaml_parser_t *parser, yoml_parse_args_t *parse_args)
{
    size_t i, j;

    switch ((*target)->type) {
    case YOML_TYPE_SCALAR:
        break;
    case YOML_TYPE_SEQUENCE:
        for (i = 0; i != (*target)->data.sequence.size; ++i) {
            if (yoml__resolve_merge((*target)->data.sequence.elements + i, parser, parse_args) != 0)
                return -1;
        }
        break;
    case YOML_TYPE_MAPPING:
        if ((*target)->data.mapping.size != 0) {
            i = (*target)->data.mapping.size;
            do {
                --i;
                if (yoml__resolve_merge(&(*target)->data.mapping.elements[i].key, parser, parse_args) != 0)
                    return -1;
                if (yoml__resolve_merge(&(*target)->data.mapping.elements[i].value, parser, parse_args) != 0)
                    return -1;
                if ((*target)->data.mapping.elements[i].key->type == YOML_TYPE_SCALAR &&
                    strcmp((*target)->data.mapping.elements[i].key->data.scalar, "<<") == 0) {
                    /* erase the slot (as well as preserving the values) */
                    yoml_mapping_element_t src = (*target)->data.mapping.elements[i];
                    memmove((*target)->data.mapping.elements + i, (*target)->data.mapping.elements + i + 1,
                            ((*target)->data.mapping.size - i - 1) * sizeof((*target)->data.mapping.elements[0]));
                    --(*target)->data.mapping.size;
                    /* merge */
                    if (src.value->type == YOML_TYPE_SEQUENCE) {
                        for (j = 0; j != src.value->data.sequence.size; ++j)
                            if (yoml__merge(target, i, src.value->data.sequence.elements[j]) != 0) {
                            MergeError:
                                if (parser != NULL) {
                                    parser->problem = "value of the merge key MUST be a mapping or a sequence of mappings";
                                    parser->problem_mark.line = src.key->line;
                                    parser->problem_mark.column = src.key->column;
                                }
                                return -1;
                            }
                    } else {
                        if (yoml__merge(target, i, src.value) != 0)
                            goto MergeError;
                    }
                    /* cleanup */
                    yoml_free(src.key, parse_args->mem_set);
                    yoml_free(src.value, parse_args->mem_set);
                }
            } while (i != 0);
        }
        break;
    case YOML__TYPE_UNRESOLVED_ALIAS:
        assert(!"unreachable");
        break;
    }

    return 0;
}